

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

float GetColumnWidthEx(ImGuiColumns *columns,int column_index,bool before_resize)

{
  ImGuiColumnData *pIVar1;
  byte in_DL;
  ImGuiColumns *in_RDI;
  float fVar2;
  float offset_norm;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  float local_14;
  
  if ((in_DL & 1) == 0) {
    pIVar1 = ImVector<ImGuiColumnData>::operator[]
                       ((ImVector<ImGuiColumnData> *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    local_14 = pIVar1->OffsetNorm;
    pIVar1 = ImVector<ImGuiColumnData>::operator[]
                       ((ImVector<ImGuiColumnData> *)CONCAT44(local_14,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    local_14 = local_14 - pIVar1->OffsetNorm;
  }
  else {
    pIVar1 = ImVector<ImGuiColumnData>::operator[]
                       ((ImVector<ImGuiColumnData> *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    local_14 = pIVar1->OffsetNormBeforeResize;
    pIVar1 = ImVector<ImGuiColumnData>::operator[]
                       ((ImVector<ImGuiColumnData> *)
                        CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        in_stack_ffffffffffffffdc);
    local_14 = local_14 - pIVar1->OffsetNormBeforeResize;
  }
  fVar2 = ImGui::GetColumnOffsetFromNorm(in_RDI,local_14);
  return fVar2;
}

Assistant:

static float GetColumnWidthEx(ImGuiColumns* columns, int column_index, bool before_resize = false)
{
    if (column_index < 0)
        column_index = columns->Current;

    float offset_norm;
    if (before_resize)
        offset_norm = columns->Columns[column_index + 1].OffsetNormBeforeResize - columns->Columns[column_index].OffsetNormBeforeResize;
    else
        offset_norm = columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm;
    return ImGui::GetColumnOffsetFromNorm(columns, offset_norm);
}